

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::CLDeviceIDs>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  vector<int,_std::allocator<int>_> *this;
  void *pvVar1;
  void *match;
  ValueType *value;
  TypedFieldMap *dst_local;
  char *src_local;
  OptInfo *info_local;
  
  this = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  memset(this,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(this);
  if (info->parse == (GenericParseFunc)0x0) {
    pvVar1 = findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    std::vector<int,_std::allocator<int>_>::operator=
              (this,(vector<int,_std::allocator<int>_> *)((long)pvVar1 + 8));
  }
  else {
    (*info->parse)(src,this);
  }
  TypedFieldMap::set<tcu::opt::CLDeviceIDs>(dst,this);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}